

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O0

int xz_skip(xz_statep state,uint64_t len)

{
  int iVar1;
  uint local_28;
  uint64_t uStack_20;
  uint n;
  uint64_t len_local;
  xz_statep state_local;
  
  uStack_20 = len;
  while( true ) {
    while( true ) {
      if (uStack_20 == 0) {
        return 0;
      }
      if (state->have == 0) break;
      if (uStack_20 < state->have) {
        local_28 = (uint)uStack_20;
      }
      else {
        local_28 = state->have;
      }
      state->have = state->have - local_28;
      state->next = state->next + local_28;
      state->pos = (ulong)local_28 + state->pos;
      uStack_20 = uStack_20 - local_28;
    }
    if ((state->eof != 0) && ((state->strm).avail_in == 0)) break;
    iVar1 = xz_make(state);
    if (iVar1 == -1) {
      return -1;
    }
  }
  return 0;
}

Assistant:

static int
xz_skip(xz_statep state, uint64_t len)
{
    unsigned n;

    /* skip over len bytes or reach end-of-file, whichever comes first */
    while (len)
        /* skip over whatever is in output buffer */
        if (state->have) {
            n = (uint64_t) state->have > len ?
                (unsigned) len : state->have;
            state->have -= n;
            state->next += n;
            state->pos += n;
            len -= n;
        }

    /* output buffer empty -- return if we're at the end of the input */
        else if (state->eof && state->strm.avail_in == 0)
            break;

    /* need more data to skip -- load up output buffer */
        else {
            /* get more output, looking for header if required */
            if (xz_make(state) == -1)
                return -1;
        }
    return 0;
}